

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O3

bool __thiscall ON_LineCurve::ChangeDimension(ON_LineCurve *this,int desired_dimension)

{
  double dVar1;
  int iVar2;
  int iVar3;
  double *pdVar4;
  
  if (((desired_dimension & 0xfffffffeU) != 2) || (this->m_dim == desired_dimension))
  goto LAB_004ca0bb;
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  if (desired_dimension == 2) {
    dVar1 = (this->m_line).from.x;
    if ((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) {
      (this->m_line).from.z = 0.0;
    }
    dVar1 = (this->m_line).to.x;
    if ((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) {
      pdVar4 = &(this->m_line).to.z;
      iVar2 = 2;
LAB_004ca0aa:
      iVar3 = iVar2;
      *pdVar4 = 0.0;
    }
    else {
      iVar3 = 2;
    }
  }
  else {
    iVar3 = 3;
    if ((this->m_dim == 2) &&
       ((dVar1 = (this->m_line).from.x, dVar1 != -1.23432101234321e+308 || (NAN(dVar1))))) {
      pdVar4 = &(this->m_line).from.z;
      dVar1 = (this->m_line).from.z;
      if ((dVar1 == -1.23432101234321e+308) && (!NAN(dVar1))) {
        *pdVar4 = 0.0;
      }
      dVar1 = (this->m_line).to.z;
      if ((dVar1 == -1.23432101234321e+308) && (iVar2 = 3, !NAN(dVar1))) goto LAB_004ca0aa;
    }
  }
  this->m_dim = iVar3;
LAB_004ca0bb:
  return (desired_dimension & 0xfffffffeU) == 2;
}

Assistant:

bool ON_LineCurve::ChangeDimension( int desired_dimension )
{
  bool rc = (desired_dimension>=2 && desired_dimension<=3);

  if (rc && m_dim != desired_dimension )
  {
    DestroyCurveTree();
    if ( desired_dimension == 2 )
    {
      // 7 April 2003 Dale Lear - zero z coords if x coord are set
      if( ON_UNSET_VALUE != m_line.from.x )
        m_line.from.z = 0.0;
      if( ON_UNSET_VALUE != m_line.to.x )
        m_line.to.z = 0.0;
      m_dim = 2;
    }
    else
    {
      if ( 2 == m_dim  )
      {
        // 7 April 2003 Dale Lear
        // zero z coords if x coords are set and z coords are not set
        if( ON_UNSET_VALUE != m_line.from.x && ON_UNSET_VALUE == m_line.from.z )
          m_line.from.z = 0.0;
        if( ON_UNSET_VALUE != m_line.from.x && ON_UNSET_VALUE == m_line.to.z )
          m_line.from.z = 0.0;
      }
      m_dim = 3;
    }
  }

  return rc;
}